

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O2

bool wasm::StackUtils::mayBeUnreachable(Expression *expr)

{
  Id IVar1;
  Break *pBVar2;
  CallIndirect *pCVar3;
  Call *pCVar4;
  undefined1 uVar5;
  
  IVar1 = expr->_id;
  uVar5 = 1;
  switch(IVar1) {
  case BlockId:
  case IfId:
  case LoopId:
  case SwitchId:
  case ReturnId:
    break;
  case BreakId:
    pBVar2 = Expression::cast<wasm::Break>(expr);
    uVar5 = pBVar2->condition == (Expression *)0x0;
    break;
  case CallId:
    pCVar4 = Expression::cast<wasm::Call>(expr);
    uVar5 = pCVar4->isReturn;
    break;
  case CallIndirectId:
    pCVar3 = Expression::cast<wasm::CallIndirect>(expr);
    uVar5 = pCVar3->isReturn;
    break;
  default:
    if ((IVar1 < 0x38) && ((0xf0000000800000U >> ((ulong)(uint)IVar1 & 0x3f) & 1) != 0)) {
      return true;
    }
  case LocalGetId:
  case LocalSetId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ConstId:
  case UnaryId:
  case BinaryId:
  case SelectId:
  case DropId:
    uVar5 = 0;
  }
  return (bool)uVar5;
}

Assistant:

bool mayBeUnreachable(Expression* expr) {
  if (Properties::isControlFlowStructure(expr)) {
    return true;
  }
  switch (expr->_id) {
    case Expression::Id::BreakId:
      return expr->cast<Break>()->condition == nullptr;
    case Expression::Id::CallId:
      return expr->cast<Call>()->isReturn;
    case Expression::Id::CallIndirectId:
      return expr->cast<CallIndirect>()->isReturn;
    case Expression::Id::ReturnId:
    case Expression::Id::SwitchId:
    case Expression::Id::UnreachableId:
    case Expression::Id::ThrowId:
    case Expression::Id::RethrowId:
      return true;
    default:
      return false;
  }
}